

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  long lVar1;
  bool bVar2;
  Enum EVar3;
  Enum EVar4;
  Address AVar5;
  ulong uVar6;
  Type local_84;
  mapped_type *local_80;
  mapped_type *access;
  mapped_type *var;
  undefined1 local_68 [8];
  string name;
  Address byte_size;
  Node *addr_exp_local;
  Address align_local;
  uint64_t offset_local;
  LoadStoreTracking *this_local;
  Type type_local;
  Opcode opc_local;
  
  align_local = offset;
  offset_local = (uint64_t)this;
  this_local._0_4_ = type.enum_;
  this_local._4_4_ = opc.enum_;
  AVar5 = Opcode::GetMemorySize((Opcode *)((long)&this_local + 4));
  name.field_2._12_4_ = this_local._4_4_;
  this_local._0_4_ = GetMemoryType(this_local._0_4_,this_local._4_4_);
  AddrExpName_abi_cxx11_((string *)local_68,this,addr_exp);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    var._4_4_ = 1;
    goto LAB_001d823c;
  }
  access = (mapped_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
           ::operator[](&this->vars,(key_type *)local_68);
  local_80 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[]((map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
                           *)access,&align_local);
  if (local_80->byte_size != 0) {
    if (local_80->byte_size == AVar5) {
      EVar3 = Type::operator_cast_to_Enum(&local_80->type);
      EVar4 = Type::operator_cast_to_Enum((Type *)&this_local);
      if ((EVar3 == EVar4) && (local_80->align == align)) goto LAB_001d8162;
    }
    local_80->is_uniform = false;
  }
LAB_001d8162:
  bVar2 = Opcode::IsNaturallyAligned((Opcode *)((long)&this_local + 4),align);
  if (!bVar2) {
    local_80->is_uniform = false;
  }
  local_80->byte_size = AVar5;
  (local_80->type).enum_ = this_local._0_4_;
  local_80->align = align;
  EVar3 = Type::operator_cast_to_Enum((Type *)((long)&access[1].align + 4));
  EVar4 = Type::operator_cast_to_Enum((Type *)&this_local);
  if (EVar3 == EVar4) {
LAB_001d81d6:
    AVar5._0_4_ = access[1].idx;
    AVar5._4_1_ = access[1].is_uniform;
    AVar5._5_3_ = *(undefined3 *)&access[1].field_0x1d;
    if ((AVar5 != align) &&
       (lVar1._0_4_ = access[1].idx, lVar1._4_1_ = access[1].is_uniform,
       lVar1._5_3_ = *(undefined3 *)&access[1].field_0x1d, lVar1 != -1)) goto LAB_001d8211;
    *(Enum *)((long)&access[1].align + 4) = this_local._0_4_;
    access[1].idx = (int)align;
    access[1].is_uniform = (bool)(char)(align >> 0x20);
    *(int3 *)&access[1].field_0x1d = (int3)(align >> 0x28);
    *(Enum *)&access[2].byte_size = this_local._4_4_;
  }
  else {
    EVar3 = Type::operator_cast_to_Enum((Type *)((long)&access[1].align + 4));
    if (EVar3 == Any) goto LAB_001d81d6;
LAB_001d8211:
    Type::Type(&local_84,Void);
    *(Enum *)((long)&access[1].align + 4) = local_84.enum_;
    access[1].idx = 0xffffffff;
    access[1].is_uniform = true;
    *(undefined3 *)&access[1].field_0x1d = 0xffffff;
  }
  var._4_4_ = 0;
LAB_001d823c:
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void LoadStore(uint64_t offset, Opcode opc, Type type, Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size &&
        ((access.byte_size != byte_size) ||
         (access.type != type) ||
         (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }